

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O2

void LabelDict::free_label_features(label_feature_map *lfm)

{
  void *prev;
  hash_elem *e;
  
  for (prev = v_hashmap<unsigned_long,_features>::iterator(lfm); prev != (void *)0x0;
      prev = v_hashmap<unsigned_long,_features>::iterator_next(lfm,prev)) {
    v_array<float>::delete_v((v_array<float> *)((long)prev + 0x10));
    v_array<unsigned_long>::delete_v((v_array<unsigned_long> *)((long)prev + 0x30));
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::delete_v((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)prev + 0x50));
  }
  v_hashmap<unsigned_long,_features>::clear(lfm);
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::delete_v(&lfm->dat);
  return;
}

Assistant:

void free_label_features(label_feature_map& lfm)
{
  void* label_iter = lfm.iterator();
  while (label_iter != nullptr)
  {
    features* res = lfm.iterator_get_value(label_iter);
    res->values.delete_v();
    res->indicies.delete_v();
    res->space_names.delete_v();

    label_iter = lfm.iterator_next(label_iter);
  }
  lfm.clear();
  lfm.delete_v();
}